

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::preprocess_op_codes(CompilerMSL *this)

{
  uint32_t id;
  ExecutionModel EVar1;
  SPIRFunction *func;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [48];
  undefined1 local_98 [8];
  OpCodePreprocessor preproc;
  CompilerMSL *this_local;
  
  preproc._128_8_ = this;
  OpCodePreprocessor::OpCodePreprocessor((OpCodePreprocessor *)local_98,this);
  id = TypedID::operator_cast_to_unsigned_int
                 ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  func = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,id);
  Compiler::traverse_all_reachable_opcodes((Compiler *)this,func,(OpcodeHandler *)local_98);
  this->suppress_missing_prototypes = (bool)((byte)preproc.image_pointers._M_h._M_single_bucket & 1)
  ;
  if ((preproc.image_pointers._M_h._M_single_bucket._1_1_ & 1) != 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_c8,"#include <metal_atomic>",&local_c9);
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,(string *)local_c8);
    ::std::__cxx11::string::~string(local_c8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_f0,"#pragma clang diagnostic ignored \"-Wunused-variable\"",&local_f1);
    add_pragma_line(this,(string *)local_f0);
    ::std::__cxx11::string::~string(local_f0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  }
  if ((preproc.image_pointers._M_h._M_single_bucket._2_1_ & 1) != 0) {
    this->is_rasterization_disabled = true;
  }
  EVar1 = Compiler::get_execution_model((Compiler *)this);
  if (EVar1 != ExecutionModelTessellationControl) {
    EVar1 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar1 != ExecutionModelVertex) || (((this->msl_options).vertex_for_tessellation & 1U) == 0)
       ) goto LAB_003d7436;
  }
  this->is_rasterization_disabled = true;
  this->capture_output_to_buffer = true;
LAB_003d7436:
  if ((preproc.image_pointers._M_h._M_single_bucket._3_1_ & 1) != 0) {
    this->needs_subgroup_invocation_id = true;
  }
  OpCodePreprocessor::~OpCodePreprocessor((OpCodePreprocessor *)local_98);
  return;
}

Assistant:

void CompilerMSL::preprocess_op_codes()
{
	OpCodePreprocessor preproc(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), preproc);

	suppress_missing_prototypes = preproc.suppress_missing_prototypes;

	if (preproc.uses_atomics)
	{
		add_header_line("#include <metal_atomic>");
		add_pragma_line("#pragma clang diagnostic ignored \"-Wunused-variable\"");
	}

	// Metal vertex functions that write to resources must disable rasterization and return void.
	if (preproc.uses_resource_write)
		is_rasterization_disabled = true;

	// Tessellation control shaders are run as compute functions in Metal, and so
	// must capture their output to a buffer.
	if (get_execution_model() == ExecutionModelTessellationControl ||
	    (get_execution_model() == ExecutionModelVertex && msl_options.vertex_for_tessellation))
	{
		is_rasterization_disabled = true;
		capture_output_to_buffer = true;
	}

	if (preproc.needs_subgroup_invocation_id)
		needs_subgroup_invocation_id = true;
}